

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportBuildFileGenerator::ComplainAboutMissingTarget
          (cmExportBuildFileGenerator *this,cmGeneratorTarget *depender,cmGeneratorTarget *dependee,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *exportFiles)

{
  cmake *this_00;
  ostream *poVar1;
  string *psVar2;
  ostringstream *this_01;
  char *pcVar3;
  undefined1 auStack_1d8 [16];
  string local_1c8;
  ostringstream e;
  
  this_01 = (ostringstream *)&e;
  std::__cxx11::ostringstream::ostringstream(this_01);
  poVar1 = std::operator<<((ostream *)this_01,"export called with target \"");
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(depender);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,"\" which requires target \"");
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::operator<<(poVar1,"\" ");
  if ((exportFiles->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (exportFiles->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pcVar3 = "that is not in any export set.";
  }
  else {
    poVar1 = std::operator<<((ostream *)&e,
                             "that is not in this export set, but in multiple other export sets: ");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)(auStack_1d8 + 0x10),exportFiles,", ");
    poVar1 = std::operator<<(poVar1,(string *)(auStack_1d8 + 0x10));
    std::operator<<(poVar1,".\n");
    std::__cxx11::string::~string((string *)(auStack_1d8 + 0x10));
    poVar1 = std::operator<<((ostream *)&e,
                             "An exported target cannot depend upon another target which is exported multiple times. Consider consolidating the exports of the \""
                            );
    psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
    this_01 = (ostringstream *)std::operator<<(poVar1,(string *)psVar2);
    pcVar3 = "\" target to a single export.";
  }
  std::operator<<((ostream *)this_01,pcVar3);
  this_00 = this->LG->GlobalGenerator->CMakeInstance;
  std::__cxx11::stringbuf::str();
  cmMakefile::GetBacktrace((cmMakefile *)auStack_1d8);
  cmake::IssueMessage(this_00,FATAL_ERROR,(string *)(auStack_1d8 + 0x10),
                      (cmListFileBacktrace *)auStack_1d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_1d8 + 8));
  std::__cxx11::string::~string((string *)(auStack_1d8 + 0x10));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmExportBuildFileGenerator::ComplainAboutMissingTarget(
  cmGeneratorTarget* depender, cmGeneratorTarget* dependee,
  std::vector<std::string> const& exportFiles)
{
  std::ostringstream e;
  e << "export called with target \"" << depender->GetName()
    << "\" which requires target \"" << dependee->GetName() << "\" ";
  if (exportFiles.empty()) {
    e << "that is not in any export set.";
  } else {
    e << "that is not in this export set, but in multiple other export sets: "
      << cmJoin(exportFiles, ", ") << ".\n";
    e << "An exported target cannot depend upon another target which is "
         "exported multiple times. Consider consolidating the exports of the "
         "\""
      << dependee->GetName() << "\" target to a single export.";
  }

  this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, e.str(),
    this->LG->GetMakefile()->GetBacktrace());
}